

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQArray::Mark(SQArray *this,SQCollectable **chain)

{
  SQUnsignedInteger SVar1;
  SQCollectable_conflict **in_RSI;
  SQCollectable_conflict *in_RDI;
  SQInteger i;
  SQInteger len;
  byte *o;
  
  if (((in_RDI->super_SQRefCounted)._uiRef & 0x80000000) == 0) {
    (in_RDI->super_SQRefCounted)._uiRef = (in_RDI->super_SQRefCounted)._uiRef | 0x80000000;
    SVar1 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(in_RDI + 1));
    for (o = (byte *)0x0; (long)o < (long)SVar1;
        o = (byte *)((long)&(((SQObjectPtr *)o)->super_SQObject)._type + 1)) {
      sqvector<SQObjectPtr>::operator[]((sqvector<SQObjectPtr> *)(in_RDI + 1),(SQUnsignedInteger)o);
      SQSharedState::MarkObject((SQObjectPtr *)o,(SQCollectable_conflict **)in_RDI);
    }
    SQCollectable::RemoveFromChain(&in_RDI->_sharedstate->_gc_chain,in_RDI);
    SQCollectable::AddToChain(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void SQArray::Mark(SQCollectable **chain)
{
    START_MARK()
        SQInteger len = _values.size();
        for(SQInteger i = 0;i < len; i++) SQSharedState::MarkObject(_values[i], chain);
    END_MARK()
}